

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

void __thiscall Rml::ElementScroll::FormatScrollbars(ElementScroll *this)

{
  WidgetScroll *pWVar1;
  Element *pEVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  undefined8 uVar6;
  BoxEdge edge;
  Box *this_00;
  ComputedValues *pCVar7;
  Box *pBVar8;
  Scrollbar *pSVar9;
  BoxEdge edge_00;
  long lVar10;
  int i;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_118;
  float fStack_114;
  Vector2f containing_block;
  float local_f8;
  float local_e8;
  float fStack_e4;
  Box corner_box;
  Vector2f offset;
  
  this_00 = Element::GetBox(this->element);
  VVar3 = Box::GetSize(this_00,Padding);
  lVar10 = 4;
  pSVar9 = this->scrollbars;
  containing_block = VVar3;
  for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
    if (pSVar9->enabled == true) {
      pWVar1 = (pSVar9->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
               _M_t.
               super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
               super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
      if (uVar11 == 0) {
        fVar12 = Element::GetClientHeight(this->element);
        WidgetScroll::SetBarLength(pWVar1,fVar12);
        pWVar1 = (pSVar9->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar12 = Element::GetScrollHeight(this->element);
        WidgetScroll::SetTrackLength(pWVar1,fVar12);
        fVar12 = Element::GetScrollHeight(this->element);
        fVar13 = Element::GetClientHeight(this->element);
        pWVar1 = (pSVar9->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar12 - fVar13 <= 0.0) {
          fVar14 = 0.0;
        }
        else {
          fVar14 = Element::GetScrollTop(this->element);
          fVar14 = fVar14 / (fVar12 - fVar13);
        }
        WidgetScroll::SetBarPosition(pWVar1,fVar14);
        edge_00 = Top;
        edge = Right;
      }
      else {
        fVar12 = Element::GetClientWidth(this->element);
        WidgetScroll::SetBarLength(pWVar1,fVar12);
        pWVar1 = (pSVar9->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar12 = Element::GetScrollWidth(this->element);
        WidgetScroll::SetTrackLength(pWVar1,fVar12);
        fVar12 = Element::GetScrollWidth(this->element);
        fVar13 = Element::GetClientWidth(this->element);
        pWVar1 = (pSVar9->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar12 - fVar13 <= 0.0) {
          fVar14 = 0.0;
        }
        else {
          fVar14 = Element::GetScrollLeft(this->element);
          fVar14 = fVar14 / (fVar12 - fVar13);
        }
        WidgetScroll::SetBarPosition(pWVar1,fVar14);
        edge_00 = Left;
        edge = Bottom;
      }
      fVar12 = *(float *)((long)&containing_block.x + lVar10);
      pCVar7 = Element::GetComputedValues(pSVar9->element);
      fVar13 = (pCVar7->rare).scrollbar_margin;
      fVar14 = 0.0;
      if (this->scrollbars[uVar11 ^ 1].enabled == true) {
        fVar14 = this->scrollbars[uVar11 ^ 1].size;
      }
      if (fVar13 <= fVar14) {
        fVar13 = fVar14;
      }
      WidgetScroll::FormatElements
                ((pSVar9->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl,VVar3,
                 fVar12 - fVar13);
      offset = Box::GetPosition(this_00,Padding);
      fVar12 = (&containing_block.x)[uVar11];
      pBVar8 = Element::GetBox(pSVar9->element);
      corner_box.content = Box::GetSize(pBVar8,Border);
      fVar13 = *(float *)((long)(corner_box.area_edges + -1) + 8 + uVar11 * 4);
      pBVar8 = Element::GetBox(pSVar9->element);
      fVar14 = Box::GetEdge(pBVar8,Margin,edge);
      (&offset.x)[uVar11] = (fVar12 - (fVar14 + fVar13)) + (&offset.x)[uVar11];
      pBVar8 = Element::GetBox(pSVar9->element);
      fVar12 = Box::GetEdge(pBVar8,Margin,edge_00);
      *(float *)((long)&offset.x + lVar10) = fVar12 + *(float *)((long)&offset.x + lVar10);
      Element::SetOffset(pSVar9->element,offset,this->element,true);
    }
    lVar10 = lVar10 + -4;
    pSVar9 = pSVar9 + 1;
  }
  if ((this->scrollbars[0].enabled != false) && (this->scrollbars[1].enabled == true)) {
    CreateCorner(this);
    Box::Box(&corner_box);
    local_e8 = VVar3.x;
    VVar4.y = local_e8;
    VVar4.x = local_e8;
    LayoutDetails::BuildBox(&corner_box,VVar4,this->corner,Block);
    VVar5.y = this->scrollbars[1].size;
    VVar5.x = this->scrollbars[0].size;
    Box::SetContent(&corner_box,VVar5);
    Element::SetBox(this->corner,&corner_box);
    pEVar2 = this->corner;
    VVar4 = Box::GetPosition(this_00,Padding);
    uVar6 = *(undefined8 *)&this->scrollbars[0].size;
    fVar12 = this->scrollbars[1].size;
    VVar5 = Box::GetPosition(&corner_box,Margin);
    local_118 = VVar4.x;
    fStack_114 = VVar4.y;
    fStack_e4 = VVar3.y;
    local_f8 = (float)uVar6;
    VVar3.y = ((fStack_114 + fStack_e4) - fVar12) - VVar5.y;
    VVar3.x = ((local_118 + local_e8) - local_f8) - VVar5.x;
    Element::SetOffset(pEVar2,VVar3,this->element,true);
    pEVar2 = this->corner;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>((Property *)&offset,Visible);
    Element::SetProperty(pEVar2,Visibility,(Property *)&offset);
    Property::~Property((Property *)&offset);
    Box::~Box(&corner_box);
  }
  return;
}

Assistant:

void ElementScroll::FormatScrollbars()
{
	const Box& element_box = element->GetBox();
	const Vector2f containing_block = element_box.GetSize(BoxArea::Padding);

	for (int i = 0; i < 2; i++)
	{
		if (!scrollbars[i].enabled)
			continue;

		if (i == VERTICAL)
		{
			scrollbars[i].widget->SetBarLength(element->GetClientHeight());
			scrollbars[i].widget->SetTrackLength(element->GetScrollHeight());

			float traversable_track = element->GetScrollHeight() - element->GetClientHeight();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollTop() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}
		else
		{
			scrollbars[i].widget->SetBarLength(element->GetClientWidth());
			scrollbars[i].widget->SetTrackLength(element->GetScrollWidth());

			float traversable_track = element->GetScrollWidth() - element->GetClientWidth();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollLeft() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}

		float slider_length = containing_block[1 - i];
		float user_scrollbar_margin = scrollbars[i].element->GetComputedValues().scrollbar_margin();
		float min_scrollbar_margin = GetScrollbarSize(i == VERTICAL ? HORIZONTAL : VERTICAL);
		slider_length -= Math::Max(user_scrollbar_margin, min_scrollbar_margin);

		scrollbars[i].widget->FormatElements(containing_block, slider_length);

		int variable_axis = i == VERTICAL ? 0 : 1;
		Vector2f offset = element_box.GetPosition(BoxArea::Padding);
		offset[variable_axis] += containing_block[variable_axis] -
			(scrollbars[i].element->GetBox().GetSize(BoxArea::Border)[variable_axis] +
				scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Right : BoxEdge::Bottom));
		// Add the top or left margin (as appropriate) onto the scrollbar's position.
		offset[1 - variable_axis] += scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Top : BoxEdge::Left);
		scrollbars[i].element->SetOffset(offset, element, true);
	}

	// Format the corner, if it is necessary.
	if (scrollbars[0].enabled && scrollbars[1].enabled)
	{
		CreateCorner();

		Box corner_box;
		LayoutDetails::BuildBox(corner_box, Vector2f(containing_block.x), corner);

		corner_box.SetContent(Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size));
		corner->SetBox(corner_box);
		corner->SetOffset(containing_block + element_box.GetPosition(BoxArea::Padding) -
				Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size) - corner_box.GetPosition(BoxArea::Margin),
			element, true);

		corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
	}
}